

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O2

void Sat_MmFixedRestart(Sat_MmFixed_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  iVar2 = p->nChunks;
  if (iVar2 != 0) {
    if (iVar2 < 1) {
      __assert_fail("p->nChunks > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satMem.c"
                    ,0xf6,"void Sat_MmFixedRestart(Sat_MmFixed_t *)");
    }
    for (lVar5 = 1; lVar5 < iVar2; lVar5 = lVar5 + 1) {
      if (p->pChunks[lVar5] != (char *)0x0) {
        free(p->pChunks[lVar5]);
        p->pChunks[lVar5] = (char *)0x0;
        iVar2 = p->nChunks;
      }
    }
    p->nChunks = 1;
    iVar2 = p->nChunkSize;
    pcVar4 = *p->pChunks;
    for (iVar3 = 1; iVar3 < iVar2; iVar3 = iVar3 + 1) {
      iVar1 = p->nEntrySize;
      *(char **)pcVar4 = pcVar4 + iVar1;
      pcVar4 = pcVar4 + iVar1;
    }
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    p->pEntriesFree = *p->pChunks;
    p->nMemoryAlloc = p->nEntrySize * iVar2;
    p->nMemoryUsed = 0;
    p->nEntriesAlloc = iVar2;
    p->nEntriesUsed = 0;
  }
  return;
}

Assistant:

void Sat_MmFixedRestart( Sat_MmFixed_t * p )
{
    int i;
    char * pTemp;
    if ( p->nChunks == 0 )
        return;
    assert( p->nChunks > 0 );

    // deallocate all chunks except the first one
    for ( i = 1; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    p->nChunks = 1;
    // transform these entries into a linked list
    pTemp = p->pChunks[0];
    for ( i = 1; i < p->nChunkSize; i++ )
    {
        *((char **)pTemp) = pTemp + p->nEntrySize;
        pTemp += p->nEntrySize;
    }
    // set the last link
    *((char **)pTemp) = NULL;
    // set the free entry list
    p->pEntriesFree  = p->pChunks[0];
    // set the correct statistics
    p->nMemoryAlloc  = p->nEntrySize * p->nChunkSize;
    p->nMemoryUsed   = 0;
    p->nEntriesAlloc = p->nChunkSize;
    p->nEntriesUsed  = 0;
}